

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_36::HttpOutputStream::HttpOutputStream
          (HttpOutputStream *this,AsyncOutputStream *inner)

{
  PromiseNode *in_RAX;
  
  (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpOutputStream>).currentWrapper.ptr
       = (Maybe<kj::(anonymous_namespace)::HttpOutputStream_&> *)0x0;
  this->inner = inner;
  kj::_::readyNow();
  (this->writeQueue).super_PromiseBase.node.ptr = in_RAX;
  this->inBody = false;
  this->broken = false;
  this->writeInProgress = false;
  return;
}

Assistant:

HttpOutputStream(AsyncOutputStream& inner): inner(inner) {}